

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
absl::flags_internal::anon_unknown_0::SpecifiedFlagsCompare::operator()
          (SpecifiedFlagsCompare *this,CommandLineFlag *a,CommandLineFlag *b)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *extraout_RDX;
  char *extraout_RDX_00;
  CommandLineFlag *b_local;
  CommandLineFlag *a_local;
  SpecifiedFlagsCompare *this_local;
  
  iVar2 = (**a->_vptr_CommandLineFlag)();
  __x._M_len._4_4_ = extraout_var;
  __x._M_len._0_4_ = iVar2;
  iVar2 = (**b->_vptr_CommandLineFlag)();
  __y._M_len._4_4_ = extraout_var_00;
  __y._M_len._0_4_ = iVar2;
  __x._M_str = extraout_RDX;
  __y._M_str = extraout_RDX_00;
  bVar1 = std::operator<(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const CommandLineFlag* a, const CommandLineFlag* b) const {
    return a->Name() < b->Name();
  }